

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateXdistance::ArchiveOUT(ChLinkMateXdistance *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMateXdistance>(marchive);
  ChLinkMateGeneric::ArchiveOUT(&this->super_ChLinkMateGeneric,marchive);
  local_28._value = &this->distance;
  local_28._name = "distance";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChLinkMateXdistance::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMateXdistance>();

    // serialize parent class
    ChLinkMateGeneric::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(distance);
}